

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

double ipx::PrimalInfeasibility(Model *model,Vector *x)

{
  double dVar1;
  ulong uVar2;
  size_t sVar3;
  double *pdVar4;
  valarray<double> *in_RSI;
  Model *in_RDI;
  size_t j;
  double infeas;
  Vector *ub;
  Vector *lb;
  double local_40;
  double local_38;
  ulong local_30;
  double local_28;
  Vector *local_20;
  Vector *local_18;
  valarray<double> *local_10;
  Model *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = Model::lb(in_RDI);
  local_20 = Model::ub(local_8);
  local_28 = 0.0;
  local_30 = 0;
  while( true ) {
    uVar2 = local_30;
    sVar3 = std::valarray<double>::size(local_10);
    if (sVar3 <= uVar2) break;
    pdVar4 = std::valarray<double>::operator[](local_18,local_30);
    dVar1 = *pdVar4;
    pdVar4 = std::valarray<double>::operator[](local_10,local_30);
    local_38 = dVar1 - *pdVar4;
    pdVar4 = std::max<double>(&local_28,&local_38);
    local_28 = *pdVar4;
    pdVar4 = std::valarray<double>::operator[](local_10,local_30);
    dVar1 = *pdVar4;
    pdVar4 = std::valarray<double>::operator[](local_20,local_30);
    local_40 = dVar1 - *pdVar4;
    pdVar4 = std::max<double>(&local_28,&local_40);
    local_28 = *pdVar4;
    local_30 = local_30 + 1;
  }
  return local_28;
}

Assistant:

double PrimalInfeasibility(const Model& model, const Vector& x) {
    const Vector& lb = model.lb();
    const Vector& ub = model.ub();
    assert(x.size() == lb.size());

    double infeas = 0.0;
    for (size_t j = 0; j < x.size(); j++) {
        infeas = std::max(infeas, lb[j]-x[j]);
        infeas = std::max(infeas, x[j]-ub[j]);
    }
    return infeas;
}